

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.c
# Opt level: O3

int nn_device_entry(nn_device_recipe *device,int s1,int s2,int flags)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  uint flags_00;
  uint *puVar5;
  ulong uVar6;
  nn_fd s2rcv;
  nn_fd s1snd;
  nn_fd s1rcv;
  int op2;
  int op1;
  nn_fd s2snd;
  size_t local_38;
  uint local_30;
  uint local_2c;
  uint local_28;
  int local_24;
  int local_20;
  int local_1c;
  
  uVar1 = device->required_checks;
  if ((s2 & s1) < 0 && (uVar1 & 1) != 0) goto LAB_00123cdd;
  if (((uVar1 & 2) != 0) && ((iVar3 = s1, s2 < 0 || (iVar3 = s2, s1 < 0)))) {
    nn_device_loopback(device,iVar3);
    return -1;
  }
  if ((uVar1 & 0x10) == 0) {
LAB_00123c8c:
    if ((uVar1 & 0x20) == 0) {
LAB_00123c94:
      local_38 = 4;
      puVar5 = &local_28;
      uVar1 = 0;
      iVar3 = s1;
      iVar2 = nn_getsockopt(s1,0,0xb,puVar5,&local_38);
      flags_00 = (uint)puVar5;
      if (iVar2 < 0) {
        iVar3 = nn_errno();
        if (iVar3 != 0x5c) {
          return -1;
        }
        local_28 = 0xffffffff;
      }
      else {
        if (iVar2 != 0) goto LAB_0012407e;
        if (local_38 != 4) goto LAB_00124083;
        if ((int)local_28 < 0) {
          nn_device_entry_cold_7();
LAB_00123cdd:
          piVar4 = __errno_location();
          *piVar4 = 9;
          return -1;
        }
      }
      local_38 = 4;
      puVar5 = &local_2c;
      uVar1 = 0;
      iVar3 = s1;
      iVar2 = nn_getsockopt(s1,0,10,puVar5,&local_38);
      flags_00 = (uint)puVar5;
      if (iVar2 < 0) {
LAB_00123e64:
        iVar3 = nn_errno();
        if (iVar3 != 0x5c) {
          return -1;
        }
        local_2c = 0xffffffff;
      }
      else {
        if (iVar2 != 0) goto LAB_00124088;
        if (local_38 != 4) goto LAB_0012408d;
        if ((int)local_2c < 0) {
          nn_device_entry_cold_10();
          goto LAB_00123e64;
        }
      }
      local_38 = 4;
      puVar5 = &local_30;
      uVar1 = 0;
      iVar3 = s2;
      iVar2 = nn_getsockopt(s2,0,0xb,puVar5,&local_38);
      flags_00 = (uint)puVar5;
      if (iVar2 < 0) {
LAB_00123ebb:
        iVar3 = nn_errno();
        if (iVar3 != 0x5c) {
          return -1;
        }
        local_30 = 0xffffffff;
      }
      else {
        if (iVar2 != 0) goto LAB_00124092;
        if (local_38 != 4) goto LAB_00124097;
        if ((int)local_30 < 0) {
          nn_device_entry_cold_13();
          goto LAB_00123ebb;
        }
      }
      local_38 = 4;
      piVar4 = &local_1c;
      uVar6 = (ulong)(uint)s2;
      uVar1 = 0;
      iVar2 = nn_getsockopt(s2,0,10,piVar4,&local_38);
      iVar3 = (int)uVar6;
      flags_00 = (uint)piVar4;
      if (iVar2 < 0) {
LAB_00123f13:
        iVar3 = nn_errno();
        if (iVar3 != 0x5c) {
          return -1;
        }
        local_1c = -1;
      }
      else {
        if (iVar2 != 0) goto LAB_001240a1;
        if (local_38 != 4) goto LAB_001240a6;
        if (local_1c < 0) {
          nn_device_entry_cold_16();
          goto LAB_00123f13;
        }
      }
      uVar1 = device->required_checks;
      if (((uVar1 & 0x40) != 0) &&
         ((((local_1c == -1 && local_28 != 0xffffffff ||
            (local_30 == 0xffffffff && local_2c != 0xffffffff)) ||
           (uVar6 = (ulong)CONCAT31((int3)(local_30 >> 8),local_30 == 0xffffffff),
           local_2c == 0xffffffff && local_30 != 0xffffffff)) ||
          (flags_00 = CONCAT31((int3)(local_28 >> 8),local_28 != 0xffffffff || local_1c == -1),
          local_28 == 0xffffffff && local_1c != -1)))) {
LAB_00123fe7:
        piVar4 = __errno_location();
        *piVar4 = 0x16;
        return -1;
      }
      if (((uVar1 & 4) != 0) &&
         (uVar6 = CONCAT71((int7)(uVar6 >> 8),local_30 == 0xffffffff), flags_00 = local_2c,
         (local_1c != -1 && local_30 != 0xffffffff) &&
         (local_2c != 0xffffffff && local_28 != 0xffffffff))) {
        nn_device_twoway(device,s1,local_28,local_2c,s2,local_30,local_1c);
        return -1;
      }
      iVar3 = (int)uVar6;
      if ((uVar1 & 8) != 0) {
        iVar3 = (int)CONCAT71((int7)(uVar6 >> 8),local_28 == 0xffffffff);
        if ((local_1c != -1 && local_28 != 0xffffffff) && (local_2c & local_30) == 0xffffffff) {
          do {
            iVar3 = nn_device_mvmsg(device,s1,s2,0);
          } while (-1 < iVar3);
          return -1;
        }
        flags_00 = local_30;
        uVar1 = local_28;
        if (((local_28 == 0xffffffff) && (local_2c != 0xffffffff)) &&
           ((local_30 != 0xffffffff && (local_1c == -1)))) {
          do {
            iVar3 = nn_device_mvmsg(device,s2,s1,0);
          } while (-1 < iVar3);
          return -1;
        }
      }
      goto LAB_001240b5;
    }
    local_38 = 4;
    piVar4 = &local_20;
    uVar1 = 0;
    iVar3 = s1;
    iVar2 = nn_getsockopt(s1,0,0xd,piVar4,&local_38);
    flags_00 = (uint)piVar4;
    if (iVar2 != 0) {
      return -1;
    }
    if (local_38 != 4) goto LAB_0012409c;
    piVar4 = &local_24;
    uVar1 = 0;
    iVar3 = s2;
    iVar2 = nn_getsockopt(s2,0,0xd,piVar4,&local_38);
    flags_00 = (uint)piVar4;
    if (iVar2 != 0) {
      return -1;
    }
    if (local_38 == 4) {
      iVar3 = local_20 + 0xf;
      if (-1 < local_20) {
        iVar3 = local_20;
      }
      iVar2 = local_24 + 0xf;
      if (-1 < local_24) {
        iVar2 = local_24;
      }
      if (iVar3 >> 4 != iVar2 >> 4) goto LAB_00123fe7;
      goto LAB_00123c94;
    }
  }
  else {
    local_38 = 4;
    piVar4 = &local_20;
    uVar1 = 0;
    iVar3 = s1;
    iVar2 = nn_getsockopt(s1,0,0xc,piVar4,&local_38);
    flags_00 = (uint)piVar4;
    if (iVar2 != 0) {
      return -1;
    }
    if (local_38 == 4) {
      piVar4 = &local_24;
      uVar1 = 0;
      iVar3 = s2;
      iVar2 = nn_getsockopt(s2,0,0xc,piVar4,&local_38);
      flags_00 = (uint)piVar4;
      if (iVar2 != 0) {
        return -1;
      }
      if (local_38 == 4) {
        if ((local_20 != 2) || (local_24 != 2)) goto LAB_00123fe7;
        uVar1 = device->required_checks;
        goto LAB_00123c8c;
      }
    }
    else {
      nn_device_entry_cold_1();
LAB_0012407e:
      nn_device_entry_cold_5();
LAB_00124083:
      nn_device_entry_cold_6();
LAB_00124088:
      nn_device_entry_cold_8();
LAB_0012408d:
      nn_device_entry_cold_9();
LAB_00124092:
      nn_device_entry_cold_11();
LAB_00124097:
      nn_device_entry_cold_12();
LAB_0012409c:
      nn_device_entry_cold_3();
LAB_001240a1:
      nn_device_entry_cold_14();
LAB_001240a6:
      nn_device_entry_cold_15();
    }
    nn_device_entry_cold_2();
  }
  nn_device_entry_cold_4();
LAB_001240b5:
  nn_device_entry_cold_17();
  nn_device_entry(&nn_ordinary_device,iVar3,uVar1,flags_00);
  return -1;
}

Assistant:

int nn_device_entry (struct nn_device_recipe *device, int s1, int s2,
    NN_UNUSED int flags) 
{
    int rc;
    int op1;
    int op2;
    nn_fd s1rcv;
    nn_fd s1snd;
    nn_fd s2rcv;
    nn_fd s2snd;
    size_t opsz;

    /*  At least one socket must be specified. */
    if (device->required_checks & NN_CHECK_AT_LEAST_ONE_SOCKET) {
        if (s1 < 0 && s2 < 0) {
            errno = EBADF;
            return -1;
        }
    }

    /*  Handle the case when there's only one socket in the device. */
    if (device->required_checks & NN_CHECK_ALLOW_LOOPBACK) {
        if (s2 < 0)
            return nn_device_loopback (device, s1);
        if (s1 < 0)
            return nn_device_loopback (device, s2);
    }

    /*  Check whether both sockets are "raw" sockets. */
    if (device->required_checks & NN_CHECK_REQUIRE_RAW_SOCKETS) {
        opsz = sizeof (op1);
        rc = nn_getsockopt (s1, NN_SOL_SOCKET, NN_DOMAIN, &op1, &opsz);
        if (rc != 0)
            return -1;
        nn_assert (opsz == sizeof (op1));
        opsz = sizeof (op2);
        rc = nn_getsockopt (s2, NN_SOL_SOCKET, NN_DOMAIN, &op2, &opsz);
        if (rc != 0)
            return -1;
        nn_assert (opsz == sizeof (op2));
        if (op1 != AF_SP_RAW || op2 != AF_SP_RAW) {
            errno = EINVAL;
            return -1;
        }
    }

    /*  Check whether both sockets are from the same protocol. */
    if (device->required_checks & NN_CHECK_SAME_PROTOCOL_FAMILY) {
        opsz = sizeof (op1);
        rc = nn_getsockopt (s1, NN_SOL_SOCKET, NN_PROTOCOL, &op1, &opsz);
        if (rc != 0)
            return -1;
        nn_assert (opsz == sizeof (op1));
        opsz = sizeof (op2);
        rc = nn_getsockopt (s2, NN_SOL_SOCKET, NN_PROTOCOL, &op2, &opsz);
        if (rc != 0)
            return -1;
        nn_assert (opsz == sizeof (op2));
        if (op1 / 16 != op2 / 16) {
            errno = EINVAL;
            return -1;
        }
    }

    /*  Get the file descriptors for polling. */
    opsz = sizeof (s1rcv);
    rc = nn_getsockopt (s1, NN_SOL_SOCKET, NN_RCVFD, &s1rcv, &opsz);
    if (rc < 0) {
        if (nn_errno () != ENOPROTOOPT)
            return -1;
        s1rcv = -1;
    } else {
        nn_assert (rc == 0);
        nn_assert (opsz == sizeof (s1rcv));
        nn_assert (s1rcv >= 0);
    }
    opsz = sizeof (s1snd);
    rc = nn_getsockopt (s1, NN_SOL_SOCKET, NN_SNDFD, &s1snd, &opsz);
    if (rc < 0) {
        if (nn_errno () != ENOPROTOOPT)
            return -1;
        s1snd = -1;
    } else {
        nn_assert (rc == 0);
        nn_assert (opsz == sizeof (s1snd));
        nn_assert (s1snd >= 0);
    }
    opsz = sizeof (s2rcv);
    rc = nn_getsockopt (s2, NN_SOL_SOCKET, NN_RCVFD, &s2rcv, &opsz);
    if (rc < 0) {
        if (nn_errno () != ENOPROTOOPT)
            return -1;
        s2rcv = -1;
    } else {
        nn_assert (rc == 0);
        nn_assert (opsz == sizeof (s2rcv));
        nn_assert (s2rcv >= 0);
    }
    opsz = sizeof (s2snd);
    rc = nn_getsockopt (s2, NN_SOL_SOCKET, NN_SNDFD, &s2snd, &opsz);
    if (rc < 0) {
        if (nn_errno () != ENOPROTOOPT)
            return -1;
        s2snd = -1;
    } else {
        nn_assert (rc == 0);
        nn_assert (opsz == sizeof (s2snd));
        nn_assert (s2snd >= 0);
    }
    if (device->required_checks & NN_CHECK_SOCKET_DIRECTIONALITY) {
        /*  Check the directionality of the sockets. */
        if (s1rcv != -1 && s2snd == -1) {
            errno = EINVAL;
            return -1;
        }
        if (s1snd != -1 && s2rcv == -1) {
            errno = EINVAL;
            return -1;
        }
        if (s2rcv != -1 && s1snd == -1) {
            errno = EINVAL;
            return -1;
        }
        if (s2snd != -1 && s1rcv == -1) {
            errno = EINVAL;
            return -1;
        }
    }

    /*  Two-directional device. */
    if (device->required_checks & NN_CHECK_ALLOW_BIDIRECTIONAL) {
        if (s1rcv != -1 && s1snd != -1 && s2rcv != -1 && s2snd != -1)
            return nn_device_twoway (device, s1, s1rcv, s1snd,
                s2, s2rcv, s2snd);
    }

    if (device->required_checks & NN_CHECK_ALLOW_UNIDIRECTIONAL) {
        /*  Single-directional device passing messages from s1 to s2. */
        if (s1rcv != -1 && s1snd == -1 && s2rcv == -1 && s2snd != -1)
            return nn_device_oneway (device,s1, s1rcv, s2, s2snd);

        /*  Single-directional device passing messages from s2 to s1. */
        if (s1rcv == -1 && s1snd != -1 && s2rcv != -1 && s2snd == -1)
            return nn_device_oneway (device,s2, s2rcv, s1, s1snd);
    }

    /*  This should never happen. */
    nn_assert (0);
}